

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertPthreadCreate(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  ForkNode *node;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range1;
  pointer ppFVar2;
  NodeSequence NVar3;
  NodeSequence NVar4;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functionsToBeForked;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_38;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)1,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)1,llvm::CallInst_const*>(callInstruction);
  }
  NVar4.first = addNode<ForkNode>(this,node);
  dg::getCalledFunctions
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)&local_38,
             *(Value **)
              (callInstruction + (0x40 - (ulong)(uint)(*(int *)(callInstruction + 0x14) << 5))),
             (LLVMPointerAnalysis *)this->pointsToAnalysis_);
  for (ppFVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    NVar3 = createOrGetFunction(this,*ppFVar2);
    if ((EntryNode *)NVar3.first != (EntryNode *)0x0) {
      ForkNode::addForkSuccessor(NVar4.first,(EntryNode *)NVar3.first);
    }
  }
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&local_38);
  NVar4.second = &(NVar4.first)->super_Node;
  return NVar4;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadCreate(const CallInst *callInstruction) {
    ForkNode *forkNode;
    if (callInstruction->getCalledFunction()) {
        forkNode = addNode(createNode<NodeType::FORK>(callInstruction));
    } else {
        forkNode =
                addNode(createNode<NodeType::FORK>(nullptr, callInstruction));
    }
    auto *possibleFunction = callInstruction->getArgOperand(2);
    auto functionsToBeForked =
            getCalledFunctions(possibleFunction, pointsToAnalysis_);
    for (const auto *function : functionsToBeForked) {
        auto graph = createOrGetFunction(function);
        if (graph.first) {
            forkNode->addForkSuccessor(static_cast<EntryNode *>(graph.first));
        }
    }
    return {forkNode, forkNode};
}